

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

void __thiscall CLI::App::_move_to_missing(App *this,Classifier val_type,string *val)

{
  App *pAVar1;
  iterator __begin2;
  pointer psVar2;
  Classifier local_4;
  
  pAVar1 = this;
  if (this->allow_extras_ == false) {
    psVar2 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while ((pAVar1 = this,
           psVar2 != (this->subcommands_).
                     super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish &&
           ((pAVar1 = (psVar2->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
            (pAVar1->name_)._M_string_length != 0 || (pAVar1->allow_extras_ == false))))) {
      psVar2 = psVar2 + 1;
    }
  }
  ::std::
  vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
  ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
            ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
              *)&pAVar1->missing_,&local_4,val);
  return;
}

Assistant:

void _move_to_missing(detail::Classifier val_type, const std::string &val) {
        if(allow_extras_ || subcommands_.empty()) {
            missing_.emplace_back(val_type, val);
            return;
        }
        // allow extra arguments to be places in an option group if it is allowed there
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && subc->allow_extras_) {
                subc->missing_.emplace_back(val_type, val);
                return;
            }
        }
        // if we haven't found any place to put them yet put them in missing
        missing_.emplace_back(val_type, val);
    }